

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_auxv.c
# Opt level: O2

int parse_auxv_contents(void)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ssize_t sVar4;
  int *piVar5;
  uint *puVar6;
  long lVar7;
  char buffer [4096];
  
  memset(buffer,0,0x1000);
  if (parse_auxv_contents::parsed_auxv == 0) {
    parse_auxv_contents::parsed_auxv = 1;
    iVar3 = open("/proc/self/auxv",0);
    if (iVar3 != -1) {
      lVar7 = 0;
LAB_0022eced:
LAB_0022ecfa:
      while (sVar4 = read(iVar3,buffer + lVar7,0x1000 - lVar7), sVar4 == -1) {
        piVar5 = __errno_location();
        if (*piVar5 != 4) {
          close(iVar3);
          goto LAB_0022ed7f;
        }
      }
      puVar6 = (uint *)(buffer + 8);
      if (sVar4 == 0) {
        close(iVar3);
        bVar2 = false;
      }
      else {
        bVar2 = true;
        if (lVar7 != 0x1000) goto LAB_0022ed70;
      }
      do {
        lVar1 = *(long *)(puVar6 + -2);
        if (lVar1 == 6) {
          auxv_pagesz = *puVar6;
        }
        else if (lVar1 == 0x21) {
          vdso_ehdr = *(Elf64_Ehdr **)puVar6;
        }
        else if (lVar1 == 0) goto LAB_0022ed68;
        puVar6 = puVar6 + 4;
      } while( true );
    }
LAB_0022ed7f:
    parse_auxv_contents::parsed_auxv = -1;
    iVar3 = -1;
  }
  else {
    iVar3 = -(uint)(parse_auxv_contents::parsed_auxv == -1);
  }
  return iVar3;
LAB_0022ed70:
  lVar7 = lVar7 + sVar4;
  goto LAB_0022eced;
LAB_0022ed68:
  if (!bVar2) {
    return 0;
  }
  goto LAB_0022ecfa;
}

Assistant:

int parse_auxv_contents() {
  char name[] = "/proc/self/auxv";
  int fd = -1, done = 0;
  char buffer[BUFFER_LEN] = {'\0'};
  const ssize_t buffer_size = BUFFER_LEN;
  ssize_t offset = 0, result = 0;
  ElfW(auxv_t) *auxv = NULL, *a = NULL;
  static int parsed_auxv = 0;

  if (parsed_auxv) return parsed_auxv == -1 ? parsed_auxv : 0;
  parsed_auxv = 1;

  fd = gotcha_open(name, O_RDONLY);
  if (fd == -1) {
    parsed_auxv = -1;  // GCOVR_EXCL_LINE
    return -1;         // GCOVR_EXCL_LINE
  }

  do {
    for (;;) {
      result = gotcha_read(fd, buffer + offset, buffer_size - offset);
      if (result == -1) {
        if (errno == EINTR)  // GCOVR_EXCL_START
          continue;
        gotcha_close(fd);
        parsed_auxv = -1;
        return -1;
      }  // GCOVR_EXCL_STOP
      if (result == 0) {
        gotcha_close(fd);
        done = 1;
        break;
      }
      if (offset == buffer_size) {
        break;  // GCOVR_EXCL_LINE
      }
      offset += result;
    }

    auxv = (ElfW(auxv_t) *)buffer;
    for (a = auxv; a->a_type != AT_NULL; a++) {
      if (a->a_type == AT_SYSINFO_EHDR) {
        vdso_ehdr = (ElfW(Ehdr) *)a->a_un.a_val;
      } else if (a->a_type == AT_PAGESZ) {
        auxv_pagesz = (int)a->a_un.a_val;
      }
    }
  } while (!done);

  return 0;
}